

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

void __thiscall TileWire::flip(TileWire *this,bool acrossHorizontal,bool noAdjacentUpdates)

{
  Board *pBVar1;
  byte bVar2;
  byte in_DL;
  byte in_SIL;
  Tile *in_RDI;
  
  bVar2 = in_SIL & 1;
  if (*(int *)&in_RDI[8].field_0x24 == 1) {
    if (bVar2 == 0) {
      in_RDI->_direction = WEST - in_RDI->_direction;
    }
    else if ((int)in_RDI->_direction % 2 == 0) {
      in_RDI->_direction = in_RDI->_direction + EAST;
    }
    else {
      in_RDI->_direction = in_RDI->_direction - EAST;
    }
    (*in_RDI->_vptr_Tile[8])(in_RDI,0,in_DL & 1);
    pBVar1 = Tile::getBoardPtr(in_RDI);
    pBVar1->changesMade = true;
  }
  else if ((*(int *)&in_RDI[8].field_0x24 == 2) &&
          (((bVar2 == 0 && ((int)in_RDI->_direction % 2 == 0)) ||
           ((bVar2 != 0 && ((int)in_RDI->_direction % 2 == 1)))))) {
    in_RDI->_direction = (int)(in_RDI->_direction + SOUTH) % 4;
    (*in_RDI->_vptr_Tile[8])(in_RDI,0,(ulong)(in_DL & 1));
    pBVar1 = Tile::getBoardPtr(in_RDI);
    pBVar1->changesMade = true;
  }
  return;
}

Assistant:

void TileWire::flip(bool acrossHorizontal, bool noAdjacentUpdates) {
    if (_type == CORNER) {
        if (!acrossHorizontal) {
            _direction = static_cast<Direction>(3 - _direction);
        } else if (_direction % 2 == 0) {
            _direction = static_cast<Direction>(_direction + 1);
        } else {
            _direction = static_cast<Direction>(_direction - 1);
        }
        addUpdate(false, noAdjacentUpdates);
        getBoardPtr()->changesMade = true;
    } else if (_type == TEE && ((!acrossHorizontal && _direction % 2 == 0) || (acrossHorizontal && _direction % 2 == 1))) {
        _direction = static_cast<Direction>((_direction + 2) % 4);
        addUpdate(false, noAdjacentUpdates);
        getBoardPtr()->changesMade = true;
    }
}